

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O3

bool tchecker::syncprod::operator==(state_t *s1,state_t *s2)

{
  uint uVar1;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar2;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  pmVar2 = (s1->_vloc)._t;
  if ((pmVar2 == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) ||
     (pmVar3 = (s2->_vloc)._t, pmVar3 == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0)
     ) {
    __assert_fail("_t != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                  ,0x1d0,
                  "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vloc_t>]"
                 );
  }
  uVar1 = (pmVar2->super_vloc_t).super_loc_array_t.super_vloc_base_t.
          super_array_capacity_t<unsigned_int>._capacity;
  if (uVar1 == (pmVar3->super_vloc_t).super_loc_array_t.super_vloc_base_t.
               super_array_capacity_t<unsigned_int>._capacity) {
    if ((ulong)uVar1 == 0) {
      bVar5 = true;
    }
    else {
      lVar4 = 4;
      while (bVar5 = *(int *)((long)&(pmVar2->super_vloc_t).super_loc_array_t.super_vloc_base_t.
                                     super_array_capacity_t<unsigned_int>._capacity + lVar4) ==
                     *(int *)((long)&(pmVar3->super_vloc_t).super_loc_array_t.super_vloc_base_t.
                                     super_array_capacity_t<unsigned_int>._capacity + lVar4), bVar5)
      {
        bVar6 = (ulong)uVar1 << 2 == lVar4;
        if (bVar6) {
          return bVar5;
        }
        lVar4 = lVar4 + 4;
        if (bVar6) {
          return bVar5;
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool operator==(tchecker::syncprod::state_t const & s1, tchecker::syncprod::state_t const & s2)
{
  return (static_cast<tchecker::ts::state_t const &>(s1) == static_cast<tchecker::ts::state_t const &>(s2) &&
          s1.vloc() == s2.vloc());
}